

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void sbs_ensure_room(sbs_t *sbs,uint32_t v)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  
  if (sbs->size <= v >> 6) {
    uVar3 = (v >> 6) * 3 + 3 >> 1;
    puVar1 = (uint64_t *)realloc(sbs->words,(ulong)(uVar3 * 8));
    sbs->words = puVar1;
    for (uVar2 = (ulong)sbs->size; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      puVar1[uVar2] = 0;
    }
    sbs->size = uVar3;
  }
  return;
}

Assistant:

void sbs_ensure_room(sbs_t *sbs, uint32_t v) {
    uint32_t i = v / 64;
    if (i >= sbs->size) {
        uint32_t new_size = (i + 1) * 3 / 2;
        sbs->words =
            (uint64_t *)realloc(sbs->words, new_size * sizeof(uint64_t));
        for (uint32_t j = sbs->size; j < new_size; j++) {
            sbs->words[j] = 0;
        }
        sbs->size = new_size;
    }
}